

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void cashew::ValueBuilder::appendCaseToSwitch(Ref switch_,Ref arg)

{
  bool bVar1;
  Ref *pRVar2;
  Value *this;
  Value *pVVar3;
  Ref r;
  Ref local_28;
  Ref local_20;
  Ref local_18;
  Ref arg_local;
  Ref switch__local;
  
  local_18.inst = arg.inst;
  arg_local = switch_;
  pRVar2 = Ref::operator[](&arg_local,0);
  bVar1 = Ref::operator==(pRVar2,(IString *)SWITCH);
  if (!bVar1) {
    __assert_fail("switch_[0] == SWITCH",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x6e6,"static void cashew::ValueBuilder::appendCaseToSwitch(Ref, Ref)");
  }
  pRVar2 = Ref::operator[](&arg_local,2);
  this = Ref::operator->(pRVar2);
  local_28 = makeRawArray(2);
  pVVar3 = Ref::operator->(&local_28);
  pVVar3 = cashew::Value::push_back(pVVar3,local_18);
  r = makeRawArray(0);
  pVVar3 = cashew::Value::push_back(pVVar3,r);
  Ref::Ref(&local_20,pVVar3);
  cashew::Value::push_back(this,local_20);
  return;
}

Assistant:

static void appendCaseToSwitch(Ref switch_, Ref arg) {
    assert(switch_[0] == SWITCH);
    switch_[2]->push_back(
      &makeRawArray(2)->push_back(arg).push_back(makeRawArray()));
  }